

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::iterate
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  void *pvVar6;
  pointer pTVar7;
  TestError *this_00;
  pointer pTVar8;
  char *description;
  long lVar9;
  ulong uVar10;
  qpTestResult testResult;
  ulong uVar11;
  pointer_____offset_0x10___ *ppuVar12;
  ulong uVar13;
  TestContext *this_01;
  ulong uVar14;
  uint uVar15;
  ulong local_2c8;
  uchar expectedData [4];
  ostringstream local_2b0 [112];
  ios_base local_240 [264];
  uchar buffer [256];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x138);
    ppuVar12 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar5 + 0x78))(0x8ca9);
    uVar10 = 0;
    memset(buffer,0,0x100);
    pTVar7 = (this->m_textures_info).
             super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_textures_info).
        super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish == pTVar7) {
      uVar14 = 0;
    }
    else {
      uVar10 = 0;
      uVar13 = 1;
      do {
        (**(code **)(lVar5 + 0xb8))(pTVar7[uVar10].m_texture_target,pTVar7[uVar10].m_id);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(lVar5 + 0x1398))
                  (pTVar7[uVar10].m_texture_target,1,0x8058,4,4,pTVar7[uVar10].m_depth);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(lVar5 + 0x13c0))
                  (pTVar7[uVar10].m_texture_target,0,0,0,0,4,4,pTVar7[uVar10].m_depth,0x1908,0x1401,
                   buffer);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"Error configuring a texture object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                        ,0x14f);
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)(this->m_textures_info).
                      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7;
        uVar14 = lVar9 >> 4;
        bVar1 = uVar13 < uVar14;
        uVar10 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar1);
      uVar10 = lVar9 >> 2;
    }
    pvVar6 = operator_new__(uVar10);
    if (uVar14 != 0) {
      uVar4 = 1;
      lVar9 = 0;
      do {
        *(GLenum *)((long)pvVar6 + lVar9) = (&pTVar7->m_draw_buffer)[lVar9];
        uVar10 = (ulong)uVar4;
        lVar9 = lVar9 + 4;
        uVar4 = uVar4 + 1;
      } while (uVar10 < uVar14);
    }
    (**(code **)(lVar5 + 0x560))(uVar14 & 0xffffffff,pvVar6);
    operator_delete__(pvVar6);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting draw buffers!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                    ,0x161);
    pTVar7 = (this->m_textures_info).
             super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_textures_info).
        super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar7) {
      uVar4 = 1;
      uVar10 = 0;
      do {
        if (this->m_is_fbo_layered == true) {
          (**(code **)(lVar5 + 0x690))(0x8ca9,pTVar7[uVar10].m_draw_buffer,pTVar7[uVar10].m_id,0);
        }
        else {
          (**(code **)(lVar5 + 0x6b8))
                    (0x8ca9,pTVar7[uVar10].m_draw_buffer,pTVar7[uVar10].m_id,0,uVar4 - 1);
        }
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"Error configuring framebuffer objects!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                        ,0x171);
        uVar10 = (ulong)uVar4;
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = uVar4 + 1;
      } while (uVar10 < (ulong)((long)(this->m_textures_info).
                                      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 4
                               ));
    }
    iVar2 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar2 == 0x8cd5) {
      (**(code **)(lVar5 + 0x1a00))(0,0,4,4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error setting up viewport!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x182);
      (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error configuring vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x187);
      (**(code **)(lVar5 + 0x1680))(this->m_po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error using program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x18c);
      (**(code **)(lVar5 + 0x538))(this->m_draw_mode,0,this->m_n_points);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,400);
      (**(code **)(lVar5 + 0x78))(0x8ca8);
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar8 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)pTVar8 - (long)pTVar7 != 0) {
        uVar10 = (long)pTVar8 - (long)pTVar7 >> 4;
        uVar4 = pTVar7->m_depth;
        if (1 < uVar10) {
          uVar14 = 2;
          uVar13 = 1;
          do {
            uVar11 = uVar14;
            uVar15 = pTVar7[uVar13].m_depth;
            if (uVar4 < (uint)pTVar7[uVar13].m_depth) {
              uVar15 = uVar4;
            }
            uVar4 = uVar15;
            uVar14 = (ulong)((int)uVar11 + 1);
            uVar13 = uVar11;
          } while (uVar11 < uVar10);
          if (pTVar8 == pTVar7) goto LAB_00cfb2b1;
        }
        local_2c8 = 0;
        do {
          if (uVar4 != 0) {
            uVar10 = 0;
            do {
              (**(code **)(lVar5 + 0x6b8))
                        (0x8ca8,0x8ce0,
                         (this->m_textures_info).
                         super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_2c8].m_id,0,uVar10);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              glu::checkError(dVar3,"Could not set up read framebuffer!",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                              ,0x1ad);
              iVar2 = (**(code **)(lVar5 + 0x170))(0x8ca9);
              if (iVar2 != 0x8cd5) {
                _expectedData =
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b0,"Read FBO is incomplete: ",0x18);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[",1);
                std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"]",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)expectedData,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream(local_2b0);
                std::ios_base::~ios_base(local_240);
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Read FBO is incomplete.",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                           ,0x1b7);
                goto LAB_00cfb3a3;
              }
              (**(code **)(lVar5 + 0x1a00))(0,0,4,4);
              (**(code **)(lVar5 + 0x1220))(0,0,4,4,0x1908,0x1401,buffer);
              dVar3 = (**(code **)(lVar5 + 0x800))();
              glu::checkError(dVar3,"Could not read pixels using glReadPixels()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                              ,0x1bf);
              (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,uVar10,expectedData,4);
              iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                                (this,4,4,4,buffer,expectedData,local_2c8,uVar10);
              if ((char)iVar2 == '\0') {
                this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
                description = "Fail";
                testResult = QP_TEST_RESULT_FAIL;
                goto LAB_00cfb2d1;
              }
              uVar15 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar15;
            } while (uVar4 != uVar15);
            pTVar7 = (this->m_textures_info).
                     super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar8 = (this->m_textures_info).
                     super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          local_2c8 = (ulong)((int)local_2c8 + 1);
        } while (local_2c8 < (ulong)((long)pTVar8 - (long)pTVar7 >> 4));
      }
LAB_00cfb2b1:
      this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00cfb2d1:
      tcu::TestContext::setTestResult(this_01,testResult,description);
      return STOP;
    }
    _expectedData = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"Draw FBO is incomplete: ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)expectedData,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_2b0);
    std::ios_base::~ios_base(local_240);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Draw FBO is incomplete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x17c);
LAB_00cfb3a3:
    ppuVar12 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar12,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingBoundaryCondition::iterate(void)
{
	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);

	/* Set up all textures */
	unsigned char buffer[m_width * m_height * m_max_depth * m_texture_components];

	memset(buffer, 0, sizeof(buffer));

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, m_textures_info[i].m_id);
		gl.texStorage3D(m_textures_info[i].m_texture_target, 1, GL_RGBA8, m_width, m_height,
						m_textures_info[i].m_depth);
		gl.texSubImage3D(m_textures_info[i].m_texture_target, 0, 0, 0, 0, m_width, m_height, m_textures_info[i].m_depth,
						 GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a texture object!");
	}

	/* Set up draw buffers */
	{
		glw::GLenum* drawBuffers = new glw::GLenum[m_textures_info.size()];

		for (unsigned int i = 0; i < m_textures_info.size(); i++)
		{
			drawBuffers[i] = m_textures_info[i].m_draw_buffer;
		}

		gl.drawBuffers((glw::GLsizei)m_textures_info.size(), drawBuffers);

		delete[] drawBuffers;
		drawBuffers = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting draw buffers!");

	/* Configure draw FBO so that it uses texture attachments */
	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		if (m_is_fbo_layered)
		{
			gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
								  0 /* level */);
		}
		else
		{
			gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
									   0 /* level */, i /* layer */);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer objects!");
	} /* for (all textures considered) */

	/* Verify draw framebuffer is considered complete */
	glw::GLenum fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw FBO is incomplete: "
						   << "[" << fboCompleteness << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw FBO is incomplete.");
	}

	/* Set up viewport */
	gl.viewport(0, 0, m_width, m_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up viewport!");

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Render */
	gl.useProgram(m_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object!");

	gl.drawArrays(m_draw_mode, 0, m_n_points);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Bind read framebuffer object. */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);

	/* Compare the rendered data against reference representation */
	unsigned int min_depth = 0;

	if (m_textures_info.size() > 0)
	{
		min_depth = m_textures_info[0].m_depth;

		for (unsigned int nTexture = 1; nTexture < m_textures_info.size(); nTexture++)
		{
			if (min_depth > (unsigned)m_textures_info[nTexture].m_depth)
			{
				min_depth = m_textures_info[nTexture].m_depth;
			}
		}
	}

	for (unsigned int nTexture = 0; nTexture < m_textures_info.size(); nTexture++)
	{
		for (unsigned int nLayer = 0; nLayer < min_depth; nLayer++)
		{
			/* Configure read FBO's color attachment */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_textures_info[nTexture].m_id, 0,
									   nLayer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer!");

			/* Verify read framebuffer is considered complete */
			glw::GLenum _fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

			if (_fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
								   << "[" << _fboCompleteness << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL("Read FBO is incomplete.");
			}
			gl.viewport(0, 0, m_width, m_height);

			/* Read the rendered data */
			gl.readPixels(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */, GL_RGBA, GL_UNSIGNED_BYTE,
						  buffer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels using glReadPixels()");

			/* Retrieve reference color for layer */
			unsigned char expectedData[m_texture_components];

			getReferenceColor(nLayer, expectedData, m_texture_components);

			/* Compare the retrieved data with reference data */
			if (!comparePixels(m_width, m_height, m_texture_components, buffer, expectedData, nTexture, nLayer))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (data comparison failed) */
		}	 /* for (all layers) */
	}		  /* for (all texture objects) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}